

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O1

void __thiscall
Deck::discard(Deck *this,Hand *hand,vector<CardType,_std::allocator<CardType>_> *discardedCards)

{
  CardType *__src;
  CardType *__dest;
  pointer *ppCVar1;
  CardType CVar2;
  CardType CVar3;
  pointer pCVar4;
  pointer pCVar5;
  pointer pCVar6;
  vector<CardType,std::allocator<CardType>> *this_00;
  iterator __position;
  vector<CardType,_std::allocator<CardType>_> *pvVar7;
  pointer pCVar8;
  ulong uVar9;
  length_error *this_01;
  CardType *pCVar10;
  uint counter;
  long lVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  
  pCVar4 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pCVar5 = (hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar11 = 0;
  uVar13 = 0;
  do {
    pCVar6 = (discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = (long)(discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar6 >> 2;
    if (uVar9 <= uVar13) goto LAB_001038cb;
    this_00 = (vector<CardType,std::allocator<CardType>> *)this->discardPointer;
    pCVar10 = (CardType *)((long)pCVar6 + lVar11);
    __position._M_current = *(CardType **)(this_00 + 8);
    if (__position._M_current == *(CardType **)(this_00 + 0x10)) {
      std::vector<CardType,std::allocator<CardType>>::_M_realloc_insert<CardType_const&>
                (this_00,__position,pCVar10);
    }
    else {
      *__position._M_current = *pCVar10;
      *(CardType **)(this_00 + 8) = __position._M_current + 1;
    }
    uVar13 = uVar13 + 1;
    lVar11 = lVar11 + 4;
  } while (uVar13 != 3);
  uVar13 = 0;
  do {
    uVar12 = 0;
    do {
      pvVar7 = hand->handPointer;
      pCVar6 = (pvVar7->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pCVar10 = (pvVar7->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)pCVar10 - (long)pCVar6 >> 2) <= uVar12) break;
      pCVar8 = (discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = (long)(discardedCards->super__Vector_base<CardType,_std::allocator<CardType>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pCVar8 >> 2;
      if (uVar9 <= uVar13) goto LAB_001038cb;
      __dest = pCVar6 + uVar12;
      CVar2 = *__dest;
      CVar3 = pCVar8[uVar13];
      if (CVar2 == CVar3) {
        __src = __dest + 1;
        if (__src != pCVar10) {
          memmove(__dest,__src,(long)pCVar10 - (long)__src);
        }
        ppCVar1 = &(pvVar7->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + -1;
      }
      else {
        uVar12 = (ulong)((int)uVar12 + 1);
      }
    } while (CVar2 != CVar3);
    uVar13 = uVar13 + 1;
  } while (uVar13 != 3);
  if ((long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(hand->handPointer->super__Vector_base<CardType,_std::allocator<CardType>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 !=
      ((ulong)((long)pCVar4 - (long)pCVar5) >> 2 & 0xffffffff)) {
    return;
  }
LAB_001038df:
  this_01 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error
            (this_01,
             "The three cards were not removed from the hand once exchanged successfully. System exiting."
            );
  __cxa_throw(this_01,&std::length_error::typeinfo,std::length_error::~length_error);
LAB_001038cb:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar13,
             uVar9);
  goto LAB_001038df;
}

Assistant:

void Deck::discard(Hand* hand, std::vector<CardType> discardedCards) {

    unsigned int initialHandSize = hand->getHand()->size();

    for (int i = 0; i < 3; i++) {
        Deck::discardPointer->push_back(discardedCards.at(i));
    }

    for (int i = 0; i < 3; i++) {
        unsigned int counter = 0; // position in vector
        int removedCard = 0;

        while (removedCard == 0 && counter <
                                   hand->getHand()->size()) { //stop once the vector has been gone through completely or a card was removed
            if (hand->getHand()->at(counter) == discardedCards.at(i)) {
                hand->getHand()->erase(hand->getHand()->begin() + counter);
                removedCard = 1;
            } else {
                counter++;
            }
        }
    }

    // checks if the cards were removed from the hand as expected
    if (hand->getHand()->size() == initialHandSize) {
        throw std::length_error(
                "The three cards were not removed from the hand once exchanged successfully. System exiting.");
    }
}